

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::InterceptorDescriptor::~InterceptorDescriptor(InterceptorDescriptor *this)

{
  InterceptorDescriptor *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__InterceptorDescriptor_009c0d90;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  ::std::__cxx11::string::~string((string *)&this->name_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

InterceptorDescriptor::~InterceptorDescriptor() = default;